

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_utils.hpp
# Opt level: O0

char * PlatformUtilsGetEnv_abi_cxx11_(char *name)

{
  char *pcVar1;
  char *in_RSI;
  allocator local_21;
  char *local_20;
  char *str;
  char *name_local;
  
  name_local = name;
  pcVar1 = detail::ImplGetEnv(in_RSI);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)name);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)name,pcVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return name;
}

Assistant:

static inline std::string PlatformUtilsGetEnv(const char* name) {
    auto str = detail::ImplGetEnv(name);
    if (str == nullptr) {
        return {};
    }
    return str;
}